

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O3

void bfgs_factored(double *H,int N,double eps,double *xi,double *xf,double *jac,double *jacf)

{
  size_t __size;
  double dVar1;
  bool bVar2;
  ulong uVar3;
  double *C;
  double *C_00;
  double *C_01;
  double *C_02;
  double *A;
  void *__ptr;
  double *pdVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  ulong uVar13;
  uint i;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  uVar14 = (ulong)N;
  __size = uVar14 * 8;
  C = (double *)malloc(__size);
  C_00 = (double *)malloc(__size);
  C_01 = (double *)malloc(8);
  C_02 = (double *)malloc(8);
  A = (double *)malloc(__size);
  __ptr = malloc(__size);
  msub(xf,xi,C,1,N);
  msub(jacf,jac,C_00,1,N);
  dVar15 = l2norm(C,N);
  dVar16 = l2norm(C_00,N);
  if (eps < 0.0) {
    dVar17 = sqrt(eps);
  }
  else {
    dVar17 = SQRT(eps);
  }
  mmult(C_00,C,C_01,1,N,1);
  if (*C_01 < dVar16 * dVar15 * dVar17) goto LAB_0012e141;
  uVar3 = (ulong)(uint)N;
  if (0 < N) {
    uVar7 = 0;
    uVar9 = uVar3;
    pdVar4 = C;
    pdVar11 = H;
    do {
      dVar15 = 0.0;
      uVar13 = 0;
      pdVar10 = pdVar11;
      do {
        dVar15 = dVar15 + *pdVar10 * pdVar4[uVar13];
        pdVar10 = pdVar10 + uVar3;
        uVar13 = uVar13 + 1;
      } while (uVar9 != uVar13);
      A[uVar7] = dVar15;
      uVar7 = uVar7 + 1;
      pdVar11 = pdVar11 + uVar3 + 1;
      pdVar4 = pdVar4 + 1;
      uVar9 = uVar9 - 1;
    } while (uVar7 != uVar3);
  }
  mmult(A,A,C_02,1,N,1);
  dVar15 = *C_01 / *C_02;
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    dVar15 = SQRT(dVar15);
  }
  if (N < 1) goto LAB_0012e141;
  bVar2 = true;
  lVar5 = 1;
  uVar9 = 0;
  pdVar4 = H;
  do {
    dVar16 = 0.0;
    lVar12 = 0;
    do {
      dVar16 = dVar16 + pdVar4[lVar12] * A[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar5 != lVar12);
    dVar1 = C_00[uVar9];
    dVar18 = jac[uVar9];
    if (jac[uVar9] <= jacf[uVar9]) {
      dVar18 = jacf[uVar9];
    }
    *(double *)((long)__ptr + uVar9 * 8) = dVar16 * -dVar15 + dVar1;
    uVar9 = uVar9 + 1;
    if (dVar18 * dVar17 <= ABS(dVar1 - dVar16)) {
      bVar2 = false;
    }
    lVar5 = lVar5 + 1;
    pdVar4 = pdVar4 + uVar3;
  } while (uVar9 != uVar3);
  if (bVar2) goto LAB_0012e141;
  dVar15 = *C_01 * *C_02;
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    dVar15 = SQRT(dVar15);
  }
  if (N < 1) {
LAB_0012dfb4:
    bVar2 = false;
  }
  else {
    uVar9 = 0;
    do {
      A[uVar9] = A[uVar9] * (1.0 / dVar15);
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
    bVar2 = N != 1;
    if (N == 1) goto LAB_0012dfb4;
    pdVar4 = H + uVar3;
    uVar9 = 1;
    pdVar11 = H;
    do {
      pdVar11 = pdVar11 + 1;
      uVar7 = 0;
      pdVar10 = pdVar11;
      do {
        *pdVar10 = pdVar4[uVar7];
        uVar7 = uVar7 + 1;
        pdVar10 = pdVar10 + uVar3;
      } while (uVar9 != uVar7);
      uVar9 = uVar9 + 1;
      pdVar4 = pdVar4 + uVar3;
    } while (uVar9 != uVar3);
    if (N == 1) goto LAB_0012dfb4;
    lVar5 = uVar3 - 1;
    iVar6 = N + 1;
    do {
      H[(long)iVar6 + -1] = 0.0;
      iVar6 = iVar6 + N + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  do {
    uVar9 = uVar14;
    uVar14 = uVar9 - 1;
    if (((long)uVar9 < 2) || (A[uVar9 - 1] != 0.0)) break;
  } while (!NAN(A[uVar9 - 1]));
  if (1 < (long)uVar9) {
    pdVar4 = A + ((int)uVar14 - 1);
    uVar7 = uVar14 & 0xffffffff;
    do {
      i = (int)uVar7 - 1;
      uVar7 = (ulong)i;
      jrotate(H,N,*pdVar4,-pdVar4[1],i);
      dVar15 = *pdVar4;
      dVar16 = pdVar4[1];
      if ((dVar15 != 0.0) || (NAN(dVar15))) {
        dVar16 = SQRT(dVar15 * dVar15 + dVar16 * dVar16);
      }
      else {
        dVar16 = ABS(dVar16);
      }
      *pdVar4 = dVar16;
      pdVar4 = pdVar4 + -1;
    } while (0 < (int)i);
  }
  if (0 < N) {
    dVar15 = *A;
    uVar7 = 0;
    do {
      H[uVar7] = *(double *)((long)__ptr + uVar7 * 8) * dVar15 + H[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
  }
  if (1 < (long)uVar9) {
    iVar8 = 0;
    uVar9 = 0;
    iVar6 = N;
    do {
      jrotate(H,N,H[(long)iVar8 + uVar9],-H[iVar6],(int)uVar9);
      uVar9 = uVar9 + 1;
      iVar8 = iVar8 + N;
      iVar6 = iVar6 + N + 1;
    } while ((uVar14 & 0xffffffff) != uVar9);
  }
  if (bVar2) {
    pdVar4 = H + uVar3;
    uVar14 = 1;
    do {
      H = H + 1;
      uVar9 = 0;
      pdVar11 = H;
      do {
        pdVar4[uVar9] = *pdVar11;
        uVar9 = uVar9 + 1;
        pdVar11 = pdVar11 + uVar3;
      } while (uVar14 != uVar9);
      uVar14 = uVar14 + 1;
      pdVar4 = pdVar4 + uVar3;
    } while (uVar14 != uVar3);
  }
LAB_0012e141:
  free(C);
  free(C_00);
  free(C_01);
  free(C_02);
  free(A);
  free(__ptr);
  return;
}

Assistant:

void bfgs_factored(double *H,int N,double eps,double *xi,double *xf,double *jac,double *jacf) {
	int i,j,supd,ct;
	double sn,yn,fd,yt,jacm,alpha,temp3;
	double *sk,*yk,*temp,*temp2,*t,*u;
	
	sk = (double*) malloc(sizeof(double) *N);
	yk = (double*) malloc(sizeof(double) *N);
	temp = (double*) malloc(sizeof(double) *1);
	temp2 = (double*) malloc(sizeof(double) *1);
	t = (double*) malloc(sizeof(double) *N);
	u = (double*) malloc(sizeof(double) *N);
	
	msub(xf,xi,sk,1,N);
	msub(jacf,jac,yk,1,N);
	
	sn = l2norm(sk,N);
	yn = l2norm(yk,N);
	fd = sqrt(eps);
	
	mmult(yk,sk,temp,1,N,1);
	
	if (temp[0] >= fd*sn*yn) {
		for(i = 0; i < N;++i) {
			t[i] = 0.0;
			for(j = i; j < N;++j) {
				ct = j * N;
				t[i] += H[ct + i] * sk[j];
			}
		}
		mmult(t,t,temp2,1,N,1);
		alpha = sqrt(temp[0]/temp2[0]);
		supd = 1;
		for(i = 0; i < N;++i) {
			temp3 = 0.0;
			ct = i * N;
			for(j = 0; j < i+1;++j) {
				temp3 += H[ct + j] * t[j];
			}
			yt = fabs(yk[i] - temp3);
			if (jac[i] > jacf[i]) {
				jacm = jac[i];
			} else {
				jacm = jacf[i];
			}
			if (yt >= fd * jacm) {
				supd = 0;
			}
			u[i] = yk[i] - alpha*temp3;
		}
		if (supd == 0) {
			temp3 = 1.0 / sqrt(temp[0] * temp2[0]);
			for(i = 0; i < N; ++i) {
				t[i] *= temp3;
			}
			for(i = 1; i < N; ++i) {
				ct = i *N;
				for(j = 0; j < i;++j) {
					H[j*N+i] = H[ct+j];
				}
			}
			qrupdate(H,N,t,u);
			for(i = 1; i < N; ++i) {
				ct = i *N;
				for(j = 0; j < i;++j) {
					H[ct+j] = H[j*N+i];
				}
			}
		} 
	} 
	
	free(sk);
	free(yk);
	free(temp);
	free(temp2);
	free(t);
	free(u);
}